

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

int TIFFWriteDirectoryTagRational
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,double value)

{
  double value_local;
  uint16_t tag_local;
  TIFFDirEntry *dir_local;
  uint32_t *ndir_local;
  TIFF *tif_local;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    tif_local._4_4_ = 1;
  }
  else {
    tif_local._4_4_ = TIFFWriteDirectoryTagCheckedRational(tif,ndir,dir,tag,value);
  }
  return tif_local._4_4_;
}

Assistant:

static int TIFFWriteDirectoryTagRational(TIFF *tif, uint32_t *ndir,
                                         TIFFDirEntry *dir, uint16_t tag,
                                         double value)
{
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    return (TIFFWriteDirectoryTagCheckedRational(tif, ndir, dir, tag, value));
}